

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall
GlobOpt::SetObjectTypeFromTypeSym(GlobOpt *this,StackSym *typeSym,Value *value,BasicBlock *block)

{
  BVIndex i;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (typeSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x73c,"(typeSym != nullptr)","typeSym != nullptr");
    if (!bVar2) goto LAB_0046d35d;
    *puVar3 = 0;
  }
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x73d,"(value != nullptr)","value != nullptr");
    if (!bVar2) goto LAB_0046d35d;
    *puVar3 = 0;
  }
  if (value->valueInfo != (ValueInfo *)0x0) {
    bVar2 = ValueInfo::IsJsType(value->valueInfo);
    if (bVar2) goto LAB_0046d31d;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,0x73e,
                     "(value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType())",
                     "value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType()");
  if (!bVar2) {
LAB_0046d35d:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_0046d31d:
  i = (typeSym->super_Sym).m_id;
  if (block == (BasicBlock *)0x0) {
    block = this->currentBlock;
  }
  GlobOptBlockData::SetValue(&block->globOptData,value,&typeSym->super_Sym);
  BVSparse<Memory::JitArenaAllocator>::Set((block->globOptData).liveFields,i);
  return;
}

Assistant:

void
GlobOpt::SetObjectTypeFromTypeSym(StackSym *typeSym, Value* value, BasicBlock* block)
{
    Assert(typeSym != nullptr);
    Assert(value != nullptr);
    Assert(value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType());

    SymID typeSymId = typeSym->m_id;

    if (block == nullptr)
    {
        block = this->currentBlock;
    }

    block->globOptData.SetValue(value, typeSym);
    block->globOptData.liveFields->Set(typeSymId);
}